

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

Result * CoreML::Model::validate(Result *__return_storage_ptr__,Model *model)

{
  bool bVar1;
  allocator<char> local_79;
  string local_78;
  TypeCase local_54;
  undefined4 local_50;
  MLModelType type;
  undefined1 local_40 [8];
  Result result;
  Model *model_local;
  
  result.m_message.field_2._8_8_ = model;
  validateGeneric((Result *)local_40,model);
  bVar1 = Result::good((Result *)local_40);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_40);
    goto LAB_0037e9b6;
  }
  local_54 = Specification::Model::Type_case((Model *)result.m_message.field_2._8_8_);
  if (local_54 == TYPE_NOT_SET) {
LAB_0037e92d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Model did not specify a valid model-parameter type.",&local_79);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  else {
    if (local_54 == kPipelineClassifier) {
      validate<(MLModelType)200>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kPipelineRegressor) {
      validate<(MLModelType)201>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kPipeline) {
      validate<(MLModelType)202>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kGlmRegressor) {
      validate<(MLModelType)300>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kSupportVectorRegressor) {
      validate<(MLModelType)301>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kTreeEnsembleRegressor) {
      validate<(MLModelType)302>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kNeuralNetworkRegressor) {
      validate<(MLModelType)303>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kBayesianProbitRegressor) {
      validate<(MLModelType)304>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kGlmClassifier) {
      validate<(MLModelType)400>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kSupportVectorClassifier) {
      validate<(MLModelType)401>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kTreeEnsembleClassifier) {
      validate<(MLModelType)402>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kNeuralNetworkClassifier) {
      validate<(MLModelType)403>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kKNearestNeighborsClassifier) {
      validate<(MLModelType)404>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kNeuralNetwork) {
      validate<(MLModelType)500>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 == kItemSimilarityRecommender) {
      validate<(MLModelType)501>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
      goto LAB_0037e9b6;
    }
    if (local_54 != kMlProgram) {
      if (local_54 == kCustomModel) {
        validate<(MLModelType)555>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kLinkedModel) {
        validate<(MLModelType)556>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kOneHotEncoder) {
        validate<(MLModelType)600>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kImputer) {
        validate<(MLModelType)601>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kFeatureVectorizer) {
        validate<(MLModelType)602>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kDictVectorizer) {
        validate<(MLModelType)603>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kScaler) {
        validate<(MLModelType)604>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kCategoricalMapping) {
        validate<(MLModelType)606>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kNormalizer) {
        validate<(MLModelType)607>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kArrayFeatureExtractor) {
        validate<(MLModelType)609>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kNonMaximumSuppression) {
        validate<(MLModelType)610>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kIdentity) {
        validate<(MLModelType)900>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kTextClassifier) {
        validate<(MLModelType)2000>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kWordTagger) {
        validate<(MLModelType)2001>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kVisionFeaturePrint) {
        validate<(MLModelType)2002>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kSoundAnalysisPreprocessing) {
        validate<(MLModelType)2003>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kGazetteer) {
        validate<(MLModelType)2004>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kWordEmbedding) {
        validate<(MLModelType)2005>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 == kAudioFeaturePrint) {
        validate<(MLModelType)2006>(__return_storage_ptr__,(Model *)result.m_message.field_2._8_8_);
        goto LAB_0037e9b6;
      }
      if (local_54 != kSerializedModel) goto LAB_0037e92d;
    }
    Result::Result(__return_storage_ptr__);
  }
LAB_0037e9b6:
  local_50 = 1;
  Result::~Result((Result *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Result Model::validate(const Specification::Model& model) {
        Result result = validateGeneric(model);
        if (!result.good()) { return result; }

        MLModelType type = static_cast<MLModelType>(model.Type_case());
        // TODO -- is there a better way to do this than switch/case?
        // the compiler doesn't like <type> being unknown at compile time.
        switch (type) {
                VALIDATE_MODEL_TYPE(pipelineClassifier);
                VALIDATE_MODEL_TYPE(pipelineRegressor);
                VALIDATE_MODEL_TYPE(pipeline);
                VALIDATE_MODEL_TYPE(glmClassifier);
                VALIDATE_MODEL_TYPE(glmRegressor);
                VALIDATE_MODEL_TYPE(treeEnsembleClassifier);
                VALIDATE_MODEL_TYPE(treeEnsembleRegressor);
                VALIDATE_MODEL_TYPE(supportVectorClassifier);
                VALIDATE_MODEL_TYPE(supportVectorRegressor);
                VALIDATE_MODEL_TYPE(neuralNetworkClassifier);
                VALIDATE_MODEL_TYPE(neuralNetworkRegressor);
                VALIDATE_MODEL_TYPE(neuralNetwork);
                VALIDATE_MODEL_TYPE(oneHotEncoder);
                VALIDATE_MODEL_TYPE(arrayFeatureExtractor);
                VALIDATE_MODEL_TYPE(featureVectorizer);
                VALIDATE_MODEL_TYPE(imputer);
                VALIDATE_MODEL_TYPE(dictVectorizer);
                VALIDATE_MODEL_TYPE(scaler);
                VALIDATE_MODEL_TYPE(nonMaximumSuppression);
                VALIDATE_MODEL_TYPE(categoricalMapping);
                VALIDATE_MODEL_TYPE(normalizer);
                VALIDATE_MODEL_TYPE(identity);
                VALIDATE_MODEL_TYPE(customModel);
                VALIDATE_MODEL_TYPE(bayesianProbitRegressor);
                VALIDATE_MODEL_TYPE(wordTagger);
                VALIDATE_MODEL_TYPE(textClassifier);
                VALIDATE_MODEL_TYPE(gazetteer);
                VALIDATE_MODEL_TYPE(wordEmbedding);
                VALIDATE_MODEL_TYPE(visionFeaturePrint);
                VALIDATE_MODEL_TYPE(kNearestNeighborsClassifier);
                VALIDATE_MODEL_TYPE(itemSimilarityRecommender);
                VALIDATE_MODEL_TYPE(soundAnalysisPreprocessing);
                VALIDATE_MODEL_TYPE(audioFeaturePrint);
                VALIDATE_MODEL_TYPE(linkedModel);
            case MLModelType_serializedModel:
            case MLModelType_mlProgram:
                return {};
            case MLModelType_NOT_SET:
            default:
                return Result(ResultType::INVALID_MODEL_INTERFACE, "Model did not specify a valid model-parameter type.");
        }
    }